

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined4 uVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  float fVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [64];
  uint uVar74;
  undefined1 auVar75 [32];
  uint uVar77;
  uint uVar78;
  undefined1 auVar76 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2870;
  undefined8 uStack_2868;
  Geometry *local_2858;
  ulong local_2850;
  long local_2848;
  ulong local_2840;
  ulong local_2838;
  undefined8 *local_2830;
  undefined1 (*local_2828) [16];
  ulong local_2820;
  ulong local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  RTCHitN local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined4 local_2750;
  undefined4 uStack_274c;
  undefined4 uStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_2828 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar91 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = fVar2;
  local_2400._0_4_ = fVar2;
  local_2400._8_4_ = fVar2;
  local_2400._12_4_ = fVar2;
  local_2400._16_4_ = fVar2;
  local_2400._20_4_ = fVar2;
  local_2400._24_4_ = fVar2;
  local_2400._28_4_ = fVar2;
  auVar64 = ZEXT3264(local_2400);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = fVar67;
  local_2420._0_4_ = fVar67;
  local_2420._8_4_ = fVar67;
  local_2420._12_4_ = fVar67;
  local_2420._16_4_ = fVar67;
  local_2420._20_4_ = fVar67;
  local_2420._24_4_ = fVar67;
  local_2420._28_4_ = fVar67;
  auVar66 = ZEXT3264(local_2420);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar67 = fVar67 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2838 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2840 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = local_2838 ^ 0x20;
  local_2818 = local_2840 ^ 0x20;
  iVar31 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT3264(CONCAT428(iVar31,CONCAT424(iVar31,CONCAT420(iVar31,CONCAT416(iVar31,CONCAT412(
                                                  iVar31,CONCAT48(iVar31,CONCAT44(iVar31,iVar31)))))
                                               )));
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2820 = uVar34 ^ 0x20;
  local_2440._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar1;
  local_2440._12_4_ = -fVar1;
  local_2440._16_4_ = -fVar1;
  local_2440._20_4_ = -fVar1;
  local_2440._24_4_ = -fVar1;
  local_2440._28_4_ = -fVar1;
  auVar70 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar2;
  local_2460._12_4_ = -fVar2;
  local_2460._16_4_ = -fVar2;
  local_2460._20_4_ = -fVar2;
  local_2460._24_4_ = -fVar2;
  local_2460._28_4_ = -fVar2;
  auVar76 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar67,fVar67) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar67;
  local_2480._12_4_ = -fVar67;
  local_2480._16_4_ = -fVar67;
  local_2480._20_4_ = -fVar67;
  local_2480._24_4_ = -fVar67;
  local_2480._28_4_ = -fVar67;
  auVar82 = ZEXT3264(local_2480);
  iVar31 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar31;
  local_24a0._0_4_ = iVar31;
  local_24a0._8_4_ = iVar31;
  local_24a0._12_4_ = iVar31;
  local_24a0._16_4_ = iVar31;
  local_24a0._20_4_ = iVar31;
  local_24a0._24_4_ = iVar31;
  local_24a0._28_4_ = iVar31;
  auVar84 = ZEXT3264(local_24a0);
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2830 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = &DAT_3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar65._8_4_ = 0xbf800000;
  auVar65._0_8_ = 0xbf800000bf800000;
  auVar65._12_4_ = 0xbf800000;
  auVar65._16_4_ = 0xbf800000;
  auVar65._20_4_ = 0xbf800000;
  auVar65._24_4_ = 0xbf800000;
  auVar65._28_4_ = 0xbf800000;
  local_24e0 = vblendvps_avx(auVar57,auVar65,local_24c0);
  do {
    do {
      do {
        if (local_2828 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar39 = local_2828 + -1;
        local_2828 = local_2828 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar39 + 8));
      uVar43 = *(ulong *)*local_2828;
      do {
        auVar79 = auVar82._0_32_;
        auVar51 = auVar76._0_32_;
        auVar68 = auVar70._0_32_;
        auVar57 = auVar66._0_32_;
        auVar65 = auVar64._0_32_;
        if ((uVar43 & 8) == 0) {
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + local_2838),auVar68,
                                    auVar91._0_32_);
          auVar53 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + local_2840),auVar51,
                                    auVar65);
          auVar19 = vpmaxsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar53));
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar34),auVar79,auVar57);
          auVar20 = vpmaxsd_avx2(ZEXT1632(auVar48),auVar84._0_32_);
          local_2700 = vpmaxsd_avx2(auVar19,auVar20);
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar40),auVar68,
                                    auVar91._0_32_);
          auVar53 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + local_2818),auVar51,
                                    auVar65);
          auVar19 = vpminsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar53));
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + local_2820),auVar79,
                                    auVar57);
          auVar20 = vpminsd_avx2(ZEXT1632(auVar48),auVar47._0_32_);
          auVar19 = vpminsd_avx2(auVar19,auVar20);
          auVar19 = vpcmpgtd_avx2(local_2700,auVar19);
          uVar30 = vmovmskps_avx(auVar19);
          unaff_R15 = (ulong)(byte)~(byte)uVar30;
        }
        if ((uVar43 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar31 = 4;
          }
          else {
            uVar42 = uVar43 & 0xfffffffffffffff0;
            lVar41 = 0;
            for (uVar43 = unaff_R15; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              lVar41 = lVar41 + 1;
            }
            iVar31 = 0;
            uVar36 = unaff_R15 - 1 & unaff_R15;
            uVar43 = *(ulong *)(uVar42 + lVar41 * 8);
            if (uVar36 != 0) {
              uVar74 = *(uint *)(local_2700 + lVar41 * 4);
              lVar41 = 0;
              for (uVar21 = uVar36; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar41 = lVar41 + 1;
              }
              uVar36 = uVar36 - 1 & uVar36;
              uVar21 = *(ulong *)(uVar42 + lVar41 * 8);
              uVar32 = *(uint *)(local_2700 + lVar41 * 4);
              if (uVar36 == 0) {
                if (uVar74 < uVar32) {
                  *(ulong *)*local_2828 = uVar21;
                  *(uint *)(*local_2828 + 8) = uVar32;
                  local_2828 = local_2828 + 1;
                }
                else {
                  *(ulong *)*local_2828 = uVar43;
                  *(uint *)(*local_2828 + 8) = uVar74;
                  local_2828 = local_2828 + 1;
                  uVar43 = uVar21;
                }
              }
              else {
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar43;
                auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar74));
                auVar53._8_8_ = 0;
                auVar53._0_8_ = uVar21;
                auVar53 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar32));
                lVar41 = 0;
                for (uVar43 = uVar36; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000)
                {
                  lVar41 = lVar41 + 1;
                }
                uVar36 = uVar36 - 1 & uVar36;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(uVar42 + lVar41 * 8);
                auVar49 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_2700 + lVar41 * 4)));
                auVar56 = vpcmpgtd_avx(auVar53,auVar48);
                if (uVar36 == 0) {
                  auVar61 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar53,auVar48,auVar61);
                  auVar48 = vblendvps_avx(auVar48,auVar53,auVar61);
                  auVar53 = vpcmpgtd_avx(auVar49,auVar56);
                  auVar61 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar49,auVar56,auVar61);
                  auVar56 = vblendvps_avx(auVar56,auVar49,auVar61);
                  auVar49 = vpcmpgtd_avx(auVar56,auVar48);
                  auVar61 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar56,auVar48,auVar61);
                  auVar48 = vblendvps_avx(auVar48,auVar56,auVar61);
                  *local_2828 = auVar48;
                  local_2828[1] = auVar49;
                  uVar43 = auVar53._0_8_;
                  local_2828 = local_2828 + 2;
                }
                else {
                  lVar41 = 0;
                  for (uVar43 = uVar36; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000
                      ) {
                    lVar41 = lVar41 + 1;
                  }
                  uVar36 = uVar36 - 1 & uVar36;
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = *(ulong *)(uVar42 + lVar41 * 8);
                  auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_2700 + lVar41 * 4)));
                  if (uVar36 == 0) {
                    auVar17 = vpshufd_avx(auVar56,0xaa);
                    auVar56 = vblendvps_avx(auVar53,auVar48,auVar17);
                    auVar48 = vblendvps_avx(auVar48,auVar53,auVar17);
                    auVar53 = vpcmpgtd_avx(auVar61,auVar49);
                    auVar17 = vpshufd_avx(auVar53,0xaa);
                    auVar53 = vblendvps_avx(auVar61,auVar49,auVar17);
                    auVar49 = vblendvps_avx(auVar49,auVar61,auVar17);
                    auVar61 = vpcmpgtd_avx(auVar49,auVar48);
                    auVar17 = vpshufd_avx(auVar61,0xaa);
                    auVar61 = vblendvps_avx(auVar49,auVar48,auVar17);
                    auVar48 = vblendvps_avx(auVar48,auVar49,auVar17);
                    auVar49 = vpcmpgtd_avx(auVar53,auVar56);
                    auVar17 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar53,auVar56,auVar17);
                    auVar53 = vblendvps_avx(auVar56,auVar53,auVar17);
                    auVar56 = vpcmpgtd_avx(auVar61,auVar53);
                    auVar17 = vpshufd_avx(auVar56,0xaa);
                    auVar56 = vblendvps_avx(auVar61,auVar53,auVar17);
                    auVar53 = vblendvps_avx(auVar53,auVar61,auVar17);
                    *local_2828 = auVar48;
                    local_2828[1] = auVar53;
                    local_2828[2] = auVar56;
                    uVar43 = auVar49._0_8_;
                    pauVar39 = local_2828 + 3;
                  }
                  else {
                    *local_2828 = auVar48;
                    local_2828[1] = auVar53;
                    local_2828[2] = auVar49;
                    local_2828[3] = auVar61;
                    lVar41 = 0x30;
                    do {
                      lVar37 = lVar41;
                      lVar41 = 0;
                      for (uVar43 = uVar36; (uVar43 & 1) == 0;
                          uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                        lVar41 = lVar41 + 1;
                      }
                      auVar49._8_8_ = 0;
                      auVar49._0_8_ = *(ulong *)(uVar42 + lVar41 * 8);
                      auVar48 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2700 + lVar41 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2828[1] + lVar37) = auVar48;
                      uVar36 = uVar36 - 1 & uVar36;
                      lVar41 = lVar37 + 0x10;
                    } while (uVar36 != 0);
                    pauVar39 = (undefined1 (*) [16])(local_2828[1] + lVar37);
                    if (lVar37 + 0x10 != 0) {
                      lVar41 = 0x10;
                      pauVar35 = local_2828;
                      do {
                        auVar48 = pauVar35[1];
                        uVar74 = *(uint *)(pauVar35[1] + 8);
                        pauVar35 = pauVar35 + 1;
                        lVar37 = lVar41;
                        do {
                          if (uVar74 <= *(uint *)(local_2828[-1] + lVar37 + 8)) {
                            pauVar38 = (undefined1 (*) [16])(*local_2828 + lVar37);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2828 + lVar37) =
                               *(undefined1 (*) [16])(local_2828[-1] + lVar37);
                          lVar37 = lVar37 + -0x10;
                          pauVar38 = local_2828;
                        } while (lVar37 != 0);
                        *pauVar38 = auVar48;
                        lVar41 = lVar41 + 0x10;
                      } while (pauVar39 != pauVar35);
                    }
                    uVar43 = *(ulong *)*pauVar39;
                  }
                  auVar64 = ZEXT3264(auVar65);
                  auVar66 = ZEXT3264(auVar57);
                  auVar70 = ZEXT3264(auVar68);
                  auVar76 = ZEXT3264(auVar51);
                  auVar82 = ZEXT3264(auVar79);
                  auVar84 = ZEXT3264(auVar84._0_32_);
                  local_2828 = pauVar39;
                  iVar31 = 0;
                }
              }
            }
          }
        }
        else {
          iVar31 = 6;
        }
      } while (iVar31 == 0);
    } while (iVar31 != 6);
    local_2848 = (ulong)((uint)uVar43 & 0xf) - 8;
    if (local_2848 != 0) {
      uVar43 = uVar43 & 0xfffffffffffffff0;
      lVar41 = 0;
      do {
        lVar33 = lVar41 * 0x60;
        pSVar4 = context->scene;
        ppfVar5 = (pSVar4->vertices).items;
        pfVar6 = ppfVar5[*(uint *)(uVar43 + 0x40 + lVar33)];
        auVar54._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x20 + lVar33));
        auVar54._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + lVar33));
        pfVar7 = ppfVar5[*(uint *)(uVar43 + 0x48 + lVar33)];
        auVar58._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x28 + lVar33));
        auVar58._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 8 + lVar33));
        pfVar8 = ppfVar5[*(uint *)(uVar43 + 0x44 + lVar33)];
        auVar62._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x24 + lVar33));
        auVar62._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 4 + lVar33));
        pfVar9 = ppfVar5[*(uint *)(uVar43 + 0x4c + lVar33)];
        auVar75._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x2c + lVar33));
        auVar75._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0xc + lVar33));
        lVar37 = uVar43 + 0x40 + lVar33;
        local_23c0 = *(undefined8 *)(lVar37 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar37 + 0x18);
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        lVar37 = uVar43 + 0x50 + lVar33;
        local_27c0 = *(undefined8 *)(lVar37 + 0x10);
        uStack_27b8 = *(undefined8 *)(lVar37 + 0x18);
        auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x10 + lVar33)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x18 + lVar33)));
        auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x10 + lVar33)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x18 + lVar33)));
        auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x14 + lVar33)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x1c + lVar33)));
        auVar53 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x14 + lVar33)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x1c + lVar33)));
        auVar61 = vunpcklps_avx(auVar48,auVar53);
        auVar17 = vunpcklps_avx(auVar56,auVar49);
        auVar48 = vunpckhps_avx(auVar56,auVar49);
        auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x30 + lVar33)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x38 + lVar33)));
        auVar53 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x30 + lVar33)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x38 + lVar33)));
        auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x34 + lVar33)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x3c + lVar33)));
        auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x34 + lVar33)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x3c + lVar33)));
        auVar56 = vunpcklps_avx(auVar53,auVar56);
        auVar50 = vunpcklps_avx(auVar49,auVar18);
        auVar53 = vunpckhps_avx(auVar49,auVar18);
        uStack_27b0 = local_27c0;
        uStack_27a8 = uStack_27b8;
        auVar65 = vunpcklps_avx(auVar62,auVar75);
        auVar57 = vunpcklps_avx(auVar54,auVar58);
        auVar20 = vunpcklps_avx(auVar57,auVar65);
        auVar16 = vunpckhps_avx(auVar57,auVar65);
        auVar65 = vunpckhps_avx(auVar62,auVar75);
        auVar57 = vunpckhps_avx(auVar54,auVar58);
        auVar54 = vunpcklps_avx(auVar57,auVar65);
        auVar55._16_16_ = auVar17;
        auVar55._0_16_ = auVar17;
        auVar59._16_16_ = auVar48;
        auVar59._0_16_ = auVar48;
        auVar51._16_16_ = auVar61;
        auVar51._0_16_ = auVar61;
        auVar63._16_16_ = auVar50;
        auVar63._0_16_ = auVar50;
        auVar80._16_16_ = auVar53;
        auVar80._0_16_ = auVar53;
        auVar44._16_16_ = auVar56;
        auVar44._0_16_ = auVar56;
        auVar57 = vsubps_avx(auVar20,auVar55);
        auVar65 = vsubps_avx(auVar16,auVar59);
        auVar68 = vsubps_avx(auVar54,auVar51);
        auVar51 = vsubps_avx(auVar63,auVar20);
        auVar79 = vsubps_avx(auVar80,auVar16);
        auVar19 = vsubps_avx(auVar44,auVar54);
        auVar22._4_4_ = auVar65._4_4_ * auVar19._4_4_;
        auVar22._0_4_ = auVar65._0_4_ * auVar19._0_4_;
        auVar22._8_4_ = auVar65._8_4_ * auVar19._8_4_;
        auVar22._12_4_ = auVar65._12_4_ * auVar19._12_4_;
        auVar22._16_4_ = auVar65._16_4_ * auVar19._16_4_;
        auVar22._20_4_ = auVar65._20_4_ * auVar19._20_4_;
        auVar22._24_4_ = auVar65._24_4_ * auVar19._24_4_;
        auVar22._28_4_ = auVar56._12_4_;
        auVar49 = vfmsub231ps_fma(auVar22,auVar79,auVar68);
        uVar30 = *(undefined4 *)(ray + k * 4);
        auVar60._4_4_ = uVar30;
        auVar60._0_4_ = uVar30;
        auVar60._8_4_ = uVar30;
        auVar60._12_4_ = uVar30;
        auVar60._16_4_ = uVar30;
        auVar60._20_4_ = uVar30;
        auVar60._24_4_ = uVar30;
        auVar60._28_4_ = uVar30;
        uVar30 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar87._4_4_ = uVar30;
        auVar87._0_4_ = uVar30;
        auVar87._8_4_ = uVar30;
        auVar87._12_4_ = uVar30;
        auVar87._16_4_ = uVar30;
        auVar87._20_4_ = uVar30;
        auVar87._24_4_ = uVar30;
        auVar87._28_4_ = uVar30;
        uVar30 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar89._4_4_ = uVar30;
        auVar89._0_4_ = uVar30;
        auVar89._8_4_ = uVar30;
        auVar89._12_4_ = uVar30;
        auVar89._16_4_ = uVar30;
        auVar89._20_4_ = uVar30;
        auVar89._24_4_ = uVar30;
        auVar89._28_4_ = uVar30;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar81._4_4_ = fVar1;
        auVar81._0_4_ = fVar1;
        auVar81._8_4_ = fVar1;
        auVar81._12_4_ = fVar1;
        auVar81._16_4_ = fVar1;
        auVar81._20_4_ = fVar1;
        auVar81._24_4_ = fVar1;
        auVar81._28_4_ = fVar1;
        auVar23._4_4_ = auVar68._4_4_ * auVar51._4_4_;
        auVar23._0_4_ = auVar68._0_4_ * auVar51._0_4_;
        auVar23._8_4_ = auVar68._8_4_ * auVar51._8_4_;
        auVar23._12_4_ = auVar68._12_4_ * auVar51._12_4_;
        auVar23._16_4_ = auVar68._16_4_ * auVar51._16_4_;
        auVar23._20_4_ = auVar68._20_4_ * auVar51._20_4_;
        auVar23._24_4_ = auVar68._24_4_ * auVar51._24_4_;
        auVar23._28_4_ = auVar61._12_4_;
        auVar20 = vsubps_avx(auVar20,auVar60);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar85._4_4_ = fVar2;
        auVar85._0_4_ = fVar2;
        auVar85._8_4_ = fVar2;
        auVar85._12_4_ = fVar2;
        auVar85._16_4_ = fVar2;
        auVar85._20_4_ = fVar2;
        auVar85._24_4_ = fVar2;
        auVar85._28_4_ = fVar2;
        auVar61 = vfmsub231ps_fma(auVar23,auVar19,auVar57);
        auVar16 = vsubps_avx(auVar16,auVar87);
        fVar67 = *(float *)(ray + k * 4 + 0x60);
        auVar88._4_4_ = fVar67;
        auVar88._0_4_ = fVar67;
        auVar88._8_4_ = fVar67;
        auVar88._12_4_ = fVar67;
        auVar88._16_4_ = fVar67;
        auVar88._20_4_ = fVar67;
        auVar88._24_4_ = fVar67;
        auVar88._28_4_ = fVar67;
        auVar54 = vsubps_avx(auVar54,auVar89);
        auVar24._4_4_ = fVar1 * auVar16._4_4_;
        auVar24._0_4_ = fVar1 * auVar16._0_4_;
        auVar24._8_4_ = fVar1 * auVar16._8_4_;
        auVar24._12_4_ = fVar1 * auVar16._12_4_;
        auVar24._16_4_ = fVar1 * auVar16._16_4_;
        auVar24._20_4_ = fVar1 * auVar16._20_4_;
        auVar24._24_4_ = fVar1 * auVar16._24_4_;
        auVar24._28_4_ = uVar30;
        auVar48 = vfmsub231ps_fma(auVar24,auVar20,auVar85);
        auVar25._4_4_ = auVar19._4_4_ * auVar48._4_4_;
        auVar25._0_4_ = auVar19._0_4_ * auVar48._0_4_;
        auVar25._8_4_ = auVar19._8_4_ * auVar48._8_4_;
        auVar25._12_4_ = auVar19._12_4_ * auVar48._12_4_;
        auVar25._16_4_ = auVar19._16_4_ * 0.0;
        auVar25._20_4_ = auVar19._20_4_ * 0.0;
        auVar25._24_4_ = auVar19._24_4_ * 0.0;
        auVar25._28_4_ = auVar19._28_4_;
        auVar90._0_4_ = auVar68._0_4_ * auVar48._0_4_;
        auVar90._4_4_ = auVar68._4_4_ * auVar48._4_4_;
        auVar90._8_4_ = auVar68._8_4_ * auVar48._8_4_;
        auVar90._12_4_ = auVar68._12_4_ * auVar48._12_4_;
        auVar90._16_4_ = auVar68._16_4_ * 0.0;
        auVar90._20_4_ = auVar68._20_4_ * 0.0;
        auVar90._24_4_ = auVar68._24_4_ * 0.0;
        auVar90._28_4_ = 0;
        auVar19._4_4_ = fVar67 * auVar20._4_4_;
        auVar19._0_4_ = fVar67 * auVar20._0_4_;
        auVar19._8_4_ = fVar67 * auVar20._8_4_;
        auVar19._12_4_ = fVar67 * auVar20._12_4_;
        auVar19._16_4_ = fVar67 * auVar20._16_4_;
        auVar19._20_4_ = fVar67 * auVar20._20_4_;
        auVar19._24_4_ = fVar67 * auVar20._24_4_;
        auVar19._28_4_ = auVar68._28_4_;
        auVar53 = vfmsub231ps_fma(auVar19,auVar54,auVar81);
        auVar48 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar53),auVar79);
        auVar53 = vfmadd231ps_fma(auVar90,auVar65,ZEXT1632(auVar53));
        auVar68._4_4_ = auVar57._4_4_ * auVar79._4_4_;
        auVar68._0_4_ = auVar57._0_4_ * auVar79._0_4_;
        auVar68._8_4_ = auVar57._8_4_ * auVar79._8_4_;
        auVar68._12_4_ = auVar57._12_4_ * auVar79._12_4_;
        auVar68._16_4_ = auVar57._16_4_ * auVar79._16_4_;
        auVar68._20_4_ = auVar57._20_4_ * auVar79._20_4_;
        auVar68._24_4_ = auVar57._24_4_ * auVar79._24_4_;
        auVar68._28_4_ = auVar79._28_4_;
        auVar17 = vfmsub231ps_fma(auVar68,auVar51,auVar65);
        auVar79._4_4_ = fVar2 * auVar54._4_4_;
        auVar79._0_4_ = fVar2 * auVar54._0_4_;
        auVar79._8_4_ = fVar2 * auVar54._8_4_;
        auVar79._12_4_ = fVar2 * auVar54._12_4_;
        auVar79._16_4_ = fVar2 * auVar54._16_4_;
        auVar79._20_4_ = fVar2 * auVar54._20_4_;
        auVar79._24_4_ = fVar2 * auVar54._24_4_;
        auVar79._28_4_ = auVar65._28_4_;
        auVar18 = vfmsub231ps_fma(auVar79,auVar16,auVar88);
        fVar1 = auVar17._0_4_;
        fVar2 = auVar17._4_4_;
        auVar26._4_4_ = fVar67 * fVar2;
        auVar26._0_4_ = fVar67 * fVar1;
        fVar11 = auVar17._8_4_;
        auVar26._8_4_ = fVar67 * fVar11;
        fVar12 = auVar17._12_4_;
        auVar26._12_4_ = fVar67 * fVar12;
        auVar26._16_4_ = fVar67 * 0.0;
        auVar26._20_4_ = fVar67 * 0.0;
        auVar26._24_4_ = fVar67 * 0.0;
        auVar26._28_4_ = fVar67;
        auVar56 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar61),auVar85);
        auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar49),auVar81);
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),ZEXT1632(auVar18),auVar51);
        auVar65 = vandps_avx(ZEXT1632(auVar56),local_23e0);
        uVar74 = auVar65._0_4_;
        local_2700._0_4_ = (float)(uVar74 ^ auVar48._0_4_);
        uVar32 = auVar65._4_4_;
        local_2700._4_4_ = (float)(uVar32 ^ auVar48._4_4_);
        uVar77 = auVar65._8_4_;
        local_2700._8_4_ = (float)(uVar77 ^ auVar48._8_4_);
        uVar78 = auVar65._12_4_;
        local_2700._12_4_ = (float)(uVar78 ^ auVar48._12_4_);
        local_26c0._16_4_ = auVar65._16_4_;
        local_2700._16_4_ = local_26c0._16_4_;
        local_26c0._20_4_ = auVar65._20_4_;
        local_2700._20_4_ = local_26c0._20_4_;
        local_26c0._24_4_ = auVar65._24_4_;
        local_2700._24_4_ = local_26c0._24_4_;
        local_26c0._28_4_ = auVar65._28_4_;
        local_2700._28_4_ = local_26c0._28_4_;
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar57,ZEXT1632(auVar18));
        local_26e0._0_4_ = (float)(uVar74 ^ auVar48._0_4_);
        local_26e0._4_4_ = (float)(uVar32 ^ auVar48._4_4_);
        local_26e0._8_4_ = (float)(uVar77 ^ auVar48._8_4_);
        local_26e0._12_4_ = (float)(uVar78 ^ auVar48._12_4_);
        local_26e0._16_4_ = local_26c0._16_4_;
        local_26e0._20_4_ = local_26c0._20_4_;
        local_26e0._24_4_ = local_26c0._24_4_;
        local_26e0._28_4_ = local_26c0._28_4_;
        auVar65 = vcmpps_avx(local_2700,ZEXT832(0) << 0x20,5);
        auVar57 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
        auVar65 = vandps_avx(auVar65,auVar57);
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar69._16_4_ = 0x7fffffff;
        auVar69._20_4_ = 0x7fffffff;
        auVar69._24_4_ = 0x7fffffff;
        auVar69._28_4_ = 0x7fffffff;
        local_26a0 = vandps_avx(ZEXT1632(auVar56),auVar69);
        auVar57 = vcmpps_avx(ZEXT1632(auVar56),ZEXT832(0) << 0x20,4);
        auVar65 = vandps_avx(auVar65,auVar57);
        auVar83._0_4_ = local_2700._0_4_ + local_26e0._0_4_;
        auVar83._4_4_ = local_2700._4_4_ + local_26e0._4_4_;
        auVar83._8_4_ = local_2700._8_4_ + local_26e0._8_4_;
        auVar83._12_4_ = local_2700._12_4_ + local_26e0._12_4_;
        auVar83._16_4_ = local_26c0._16_4_ + local_26c0._16_4_;
        auVar83._20_4_ = local_26c0._20_4_ + local_26c0._20_4_;
        auVar83._24_4_ = local_26c0._24_4_ + local_26c0._24_4_;
        auVar83._28_4_ = local_26c0._28_4_ + local_26c0._28_4_;
        auVar57 = vcmpps_avx(auVar83,local_26a0,2);
        auVar68 = auVar57 & auVar65;
        if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar68 >> 0x7f,0) != '\0') ||
              (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar68 >> 0xbf,0) != '\0') ||
            (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar68[0x1f] < '\0') {
          auVar65 = vandps_avx(auVar65,auVar57);
          auVar48 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
          auVar27._4_4_ = fVar2 * auVar54._4_4_;
          auVar27._0_4_ = fVar1 * auVar54._0_4_;
          auVar27._8_4_ = fVar11 * auVar54._8_4_;
          auVar27._12_4_ = fVar12 * auVar54._12_4_;
          auVar27._16_4_ = auVar54._16_4_ * 0.0;
          auVar27._20_4_ = auVar54._20_4_ * 0.0;
          auVar27._24_4_ = auVar54._24_4_ * 0.0;
          auVar27._28_4_ = auVar54._28_4_;
          auVar53 = vfmadd213ps_fma(auVar16,ZEXT1632(auVar61),auVar27);
          auVar53 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar49),ZEXT1632(auVar53));
          local_26c0._0_4_ = (float)(uVar74 ^ auVar53._0_4_);
          local_26c0._4_4_ = (float)(uVar32 ^ auVar53._4_4_);
          local_26c0._8_4_ = (float)(uVar77 ^ auVar53._8_4_);
          local_26c0._12_4_ = (float)(uVar78 ^ auVar53._12_4_);
          fVar67 = *(float *)(ray + k * 4 + 0x30);
          auVar20._4_4_ = local_26a0._4_4_ * fVar67;
          auVar20._0_4_ = local_26a0._0_4_ * fVar67;
          auVar20._8_4_ = local_26a0._8_4_ * fVar67;
          auVar20._12_4_ = local_26a0._12_4_ * fVar67;
          auVar20._16_4_ = local_26a0._16_4_ * fVar67;
          auVar20._20_4_ = local_26a0._20_4_ * fVar67;
          auVar20._24_4_ = local_26a0._24_4_ * fVar67;
          auVar20._28_4_ = fVar67;
          auVar65 = vcmpps_avx(auVar20,local_26c0,1);
          fVar67 = *(float *)(ray + k * 4 + 0x80);
          auVar16._4_4_ = local_26a0._4_4_ * fVar67;
          auVar16._0_4_ = local_26a0._0_4_ * fVar67;
          auVar16._8_4_ = local_26a0._8_4_ * fVar67;
          auVar16._12_4_ = local_26a0._12_4_ * fVar67;
          auVar16._16_4_ = local_26a0._16_4_ * fVar67;
          auVar16._20_4_ = local_26a0._20_4_ * fVar67;
          auVar16._24_4_ = local_26a0._24_4_ * fVar67;
          auVar16._28_4_ = fVar67;
          auVar57 = vcmpps_avx(local_26c0,auVar16,2);
          auVar65 = vandps_avx(auVar65,auVar57);
          auVar53 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
          auVar48 = vpand_avx(auVar48,auVar53);
          auVar65 = vpmovzxwd_avx2(auVar48);
          auVar65 = vpslld_avx2(auVar65,0x1f);
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0x7f,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0xbf,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar65[0x1f] < '\0') {
            local_27e0 = vpsrad_avx2(auVar65,0x1f);
            local_2680 = ZEXT1632(auVar49);
            local_2660 = ZEXT1632(auVar61);
            local_2640 = ZEXT1632(auVar17);
            local_2620 = local_27e0;
            local_2540 = local_24c0;
            auVar57 = vrcpps_avx(local_26a0);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = &DAT_3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar86._16_4_ = 0x3f800000;
            auVar86._20_4_ = 0x3f800000;
            auVar86._24_4_ = 0x3f800000;
            auVar86._28_4_ = 0x3f800000;
            auVar53 = vfnmadd213ps_fma(local_26a0,auVar57,auVar86);
            auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar57,auVar57);
            fVar67 = auVar53._0_4_;
            fVar71 = auVar53._4_4_;
            local_25c0._4_4_ = fVar71 * local_26c0._4_4_;
            local_25c0._0_4_ = fVar67 * local_26c0._0_4_;
            fVar72 = auVar53._8_4_;
            local_25c0._8_4_ = fVar72 * local_26c0._8_4_;
            fVar73 = auVar53._12_4_;
            local_25c0._12_4_ = fVar73 * local_26c0._12_4_;
            local_25c0._16_4_ = local_26c0._16_4_ * 0.0;
            local_25c0._20_4_ = local_26c0._20_4_ * 0.0;
            local_25c0._24_4_ = local_26c0._24_4_ * 0.0;
            local_25c0._28_4_ = auVar57._28_4_;
            auVar47 = ZEXT3264(local_25c0);
            auVar28._4_4_ = fVar71 * local_2700._4_4_;
            auVar28._0_4_ = fVar67 * local_2700._0_4_;
            auVar28._8_4_ = fVar72 * local_2700._8_4_;
            auVar28._12_4_ = fVar73 * local_2700._12_4_;
            auVar28._16_4_ = local_26c0._16_4_ * 0.0;
            auVar28._20_4_ = local_26c0._20_4_ * 0.0;
            auVar28._24_4_ = local_26c0._24_4_ * 0.0;
            auVar28._28_4_ = local_26c0._28_4_;
            auVar57 = vminps_avx(auVar28,auVar86);
            auVar29._4_4_ = fVar71 * local_26e0._4_4_;
            auVar29._0_4_ = fVar67 * local_26e0._0_4_;
            auVar29._8_4_ = fVar72 * local_26e0._8_4_;
            auVar29._12_4_ = fVar73 * local_26e0._12_4_;
            auVar29._16_4_ = local_26c0._16_4_ * 0.0;
            auVar29._20_4_ = local_26c0._20_4_ * 0.0;
            auVar29._24_4_ = local_26c0._24_4_ * 0.0;
            auVar29._28_4_ = local_26c0._28_4_;
            auVar68 = vminps_avx(auVar29,auVar86);
            auVar51 = vsubps_avx(auVar86,auVar57);
            auVar79 = vsubps_avx(auVar86,auVar68);
            local_25e0 = vblendvps_avx(auVar68,auVar51,local_24c0);
            local_2600 = vblendvps_avx(auVar57,auVar79,local_24c0);
            fVar67 = local_24e0._0_4_;
            local_25a0._0_4_ = auVar49._0_4_ * fVar67;
            fVar71 = local_24e0._4_4_;
            local_25a0._4_4_ = auVar49._4_4_ * fVar71;
            fVar72 = local_24e0._8_4_;
            local_25a0._8_4_ = auVar49._8_4_ * fVar72;
            fVar73 = local_24e0._12_4_;
            local_25a0._12_4_ = auVar49._12_4_ * fVar73;
            fVar13 = local_24e0._16_4_;
            local_25a0._16_4_ = fVar13 * 0.0;
            fVar14 = local_24e0._20_4_;
            local_25a0._20_4_ = fVar14 * 0.0;
            fVar15 = local_24e0._24_4_;
            local_25a0._24_4_ = fVar15 * 0.0;
            local_25a0._28_4_ = 0;
            local_2580._0_4_ = fVar67 * auVar61._0_4_;
            local_2580._4_4_ = fVar71 * auVar61._4_4_;
            local_2580._8_4_ = fVar72 * auVar61._8_4_;
            local_2580._12_4_ = fVar73 * auVar61._12_4_;
            local_2580._16_4_ = fVar13 * 0.0;
            local_2580._20_4_ = fVar14 * 0.0;
            local_2580._24_4_ = fVar15 * 0.0;
            local_2580._28_4_ = 0;
            local_2560._0_4_ = fVar67 * fVar1;
            local_2560._4_4_ = fVar71 * fVar2;
            local_2560._8_4_ = fVar72 * fVar11;
            local_2560._12_4_ = fVar73 * fVar12;
            local_2560._16_4_ = fVar13 * 0.0;
            local_2560._20_4_ = fVar14 * 0.0;
            local_2560._24_4_ = fVar15 * 0.0;
            local_2560._28_4_ = 0;
            auVar45._8_4_ = 0x7f800000;
            auVar45._0_8_ = 0x7f8000007f800000;
            auVar45._12_4_ = 0x7f800000;
            auVar45._16_4_ = 0x7f800000;
            auVar45._20_4_ = 0x7f800000;
            auVar45._24_4_ = 0x7f800000;
            auVar45._28_4_ = 0x7f800000;
            auVar65 = vblendvps_avx(auVar45,local_25c0,auVar65);
            auVar57 = vshufps_avx(auVar65,auVar65,0xb1);
            auVar57 = vminps_avx(auVar65,auVar57);
            auVar68 = vshufpd_avx(auVar57,auVar57,5);
            auVar57 = vminps_avx(auVar57,auVar68);
            auVar68 = vpermpd_avx2(auVar57,0x4e);
            auVar57 = vminps_avx(auVar57,auVar68);
            auVar65 = vcmpps_avx(auVar65,auVar57,0);
            auVar53 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
            auVar48 = vpand_avx(auVar53,auVar48);
            auVar65 = vpmovzxwd_avx2(auVar48);
            auVar65 = vpslld_avx2(auVar65,0x1f);
            if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar65 >> 0x7f,0) == '\0') &&
                  (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar65 >> 0xbf,0) == '\0') &&
                (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar65[0x1f]) {
              auVar65 = local_27e0;
            }
            uVar32 = vmovmskps_avx(auVar65);
            uVar74 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
              uVar74 = uVar74 + 1;
            }
            do {
              local_2850 = (ulong)uVar74;
              uVar74 = *(uint *)((long)&local_23c0 + local_2850 * 4);
              local_2858 = (pSVar4->geometries).items[uVar74].ptr;
              if ((local_2858->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_27e0 + local_2850 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_2858->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar30 = *(undefined4 *)(local_2600 + local_2850 * 4);
                  uVar3 = *(undefined4 *)(local_25e0 + local_2850 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + local_2850 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25a0 + local_2850 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + local_2850 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2560 + local_2850 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_27c0 + local_2850 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar74;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                local_2520 = auVar47._0_32_;
                local_2500 = auVar91._0_32_;
                uVar30 = *(undefined4 *)(local_2600 + local_2850 * 4);
                local_2760._4_4_ = uVar30;
                local_2760._0_4_ = uVar30;
                local_2760._8_4_ = uVar30;
                local_2760._12_4_ = uVar30;
                local_2750 = *(undefined4 *)(local_25e0 + local_2850 * 4);
                local_2730._4_4_ = uVar74;
                local_2730._0_4_ = uVar74;
                local_2730._8_4_ = uVar74;
                local_2730._12_4_ = uVar74;
                uVar30 = *(undefined4 *)((long)&local_27c0 + local_2850 * 4);
                local_2740._4_4_ = uVar30;
                local_2740._0_4_ = uVar30;
                local_2740._8_4_ = uVar30;
                local_2740._12_4_ = uVar30;
                uVar30 = *(undefined4 *)(local_25a0 + local_2850 * 4);
                uVar3 = *(undefined4 *)(local_2580 + local_2850 * 4);
                local_2780._4_4_ = uVar3;
                local_2780._0_4_ = uVar3;
                local_2780._8_4_ = uVar3;
                local_2780._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_2560 + local_2850 * 4);
                local_2770._4_4_ = uVar3;
                local_2770._0_4_ = uVar3;
                local_2770._8_4_ = uVar3;
                local_2770._12_4_ = uVar3;
                local_2790[0] = (RTCHitN)(char)uVar30;
                local_2790[1] = (RTCHitN)(char)((uint)uVar30 >> 8);
                local_2790[2] = (RTCHitN)(char)((uint)uVar30 >> 0x10);
                local_2790[3] = (RTCHitN)(char)((uint)uVar30 >> 0x18);
                local_2790[4] = (RTCHitN)(char)uVar30;
                local_2790[5] = (RTCHitN)(char)((uint)uVar30 >> 8);
                local_2790[6] = (RTCHitN)(char)((uint)uVar30 >> 0x10);
                local_2790[7] = (RTCHitN)(char)((uint)uVar30 >> 0x18);
                local_2790[8] = (RTCHitN)(char)uVar30;
                local_2790[9] = (RTCHitN)(char)((uint)uVar30 >> 8);
                local_2790[10] = (RTCHitN)(char)((uint)uVar30 >> 0x10);
                local_2790[0xb] = (RTCHitN)(char)((uint)uVar30 >> 0x18);
                local_2790[0xc] = (RTCHitN)(char)uVar30;
                local_2790[0xd] = (RTCHitN)(char)((uint)uVar30 >> 8);
                local_2790[0xe] = (RTCHitN)(char)((uint)uVar30 >> 0x10);
                local_2790[0xf] = (RTCHitN)(char)((uint)uVar30 >> 0x18);
                uStack_274c = local_2750;
                uStack_2748 = local_2750;
                uStack_2744 = local_2750;
                vpcmpeqd_avx2(ZEXT1632(local_2760),ZEXT1632(local_2760));
                uStack_271c = context->user->instID[0];
                local_2720 = uStack_271c;
                uStack_2718 = uStack_271c;
                uStack_2714 = uStack_271c;
                uStack_2710 = context->user->instPrimID[0];
                uStack_270c = uStack_2710;
                uStack_2708 = uStack_2710;
                uStack_2704 = uStack_2710;
                uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + local_2850 * 4);
                local_2870 = *local_2830;
                uStack_2868 = local_2830[1];
                local_2810.valid = (int *)&local_2870;
                local_2810.geometryUserPtr = local_2858->userPtr;
                local_2810.context = context->user;
                local_2810.hit = local_2790;
                local_2810.N = 4;
                local_2810.ray = (RTCRayN *)ray;
                if (local_2858->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_2858->intersectionFilterN)(&local_2810);
                }
                auVar17._8_8_ = uStack_2868;
                auVar17._0_8_ = local_2870;
                if (auVar17 == (undefined1  [16])0x0) {
                  auVar48 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar48 = auVar48 ^ _DAT_01febe20;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_2858->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var10)(&local_2810);
                  }
                  auVar18._8_8_ = uStack_2868;
                  auVar18._0_8_ = local_2870;
                  auVar53 = vpcmpeqd_avx(auVar18,_DAT_01feba10);
                  auVar48 = auVar53 ^ _DAT_01febe20;
                  if (auVar18 != (undefined1  [16])0x0) {
                    auVar53 = auVar53 ^ _DAT_01febe20;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])local_2810.hit);
                    *(undefined1 (*) [16])(local_2810.ray + 0xc0) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x10));
                    *(undefined1 (*) [16])(local_2810.ray + 0xd0) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x20));
                    *(undefined1 (*) [16])(local_2810.ray + 0xe0) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x30));
                    *(undefined1 (*) [16])(local_2810.ray + 0xf0) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x40));
                    *(undefined1 (*) [16])(local_2810.ray + 0x100) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x50));
                    *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x60));
                    *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar56;
                    auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x70));
                    *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar56;
                    auVar53 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2810.hit + 0x80));
                    *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar53;
                  }
                }
                auVar50._8_8_ = 0x100000001;
                auVar50._0_8_ = 0x100000001;
                if ((auVar50 & auVar48) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar30;
                }
                *(undefined4 *)(local_27e0 + local_2850 * 4) = 0;
                uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar46._4_4_ = uVar30;
                auVar46._0_4_ = uVar30;
                auVar46._8_4_ = uVar30;
                auVar46._12_4_ = uVar30;
                auVar46._16_4_ = uVar30;
                auVar46._20_4_ = uVar30;
                auVar46._24_4_ = uVar30;
                auVar46._28_4_ = uVar30;
                auVar47 = ZEXT3264(local_2520);
                auVar65 = vcmpps_avx(local_2520,auVar46,2);
                local_27e0 = vandps_avx(auVar65,local_27e0);
                auVar91 = ZEXT3264(local_2500);
              }
              if ((((((((local_27e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_27e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_27e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_27e0 >> 0x7f,0) == '\0') &&
                    (local_27e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_27e0 >> 0xbf,0) == '\0') &&
                  (local_27e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_27e0[0x1f]) break;
              auVar52._8_4_ = 0x7f800000;
              auVar52._0_8_ = 0x7f8000007f800000;
              auVar52._12_4_ = 0x7f800000;
              auVar52._16_4_ = 0x7f800000;
              auVar52._20_4_ = 0x7f800000;
              auVar52._24_4_ = 0x7f800000;
              auVar52._28_4_ = 0x7f800000;
              auVar65 = vblendvps_avx(auVar52,auVar47._0_32_,local_27e0);
              auVar57 = vshufps_avx(auVar65,auVar65,0xb1);
              auVar57 = vminps_avx(auVar65,auVar57);
              auVar68 = vshufpd_avx(auVar57,auVar57,5);
              auVar57 = vminps_avx(auVar57,auVar68);
              auVar68 = vpermpd_avx2(auVar57,0x4e);
              auVar57 = vminps_avx(auVar57,auVar68);
              auVar57 = vcmpps_avx(auVar65,auVar57,0);
              auVar68 = local_27e0 & auVar57;
              auVar65 = local_27e0;
              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar68 >> 0x7f,0) != '\0') ||
                    (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0xbf,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar68[0x1f] < '\0') {
                auVar65 = vandps_avx(auVar57,local_27e0);
              }
              uVar32 = vmovmskps_avx(auVar65);
              uVar74 = 0;
              for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                uVar74 = uVar74 + 1;
              }
            } while( true );
          }
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != local_2848);
    }
    uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar47 = ZEXT3264(CONCAT428(uVar30,CONCAT424(uVar30,CONCAT420(uVar30,CONCAT416(uVar30,CONCAT412
                                                  (uVar30,CONCAT48(uVar30,CONCAT44(uVar30,uVar30))))
                                                  ))));
    auVar64 = ZEXT3264(local_2400);
    auVar66 = ZEXT3264(local_2420);
    auVar70 = ZEXT3264(local_2440);
    auVar76 = ZEXT3264(local_2460);
    auVar82 = ZEXT3264(local_2480);
    auVar84 = ZEXT3264(local_24a0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }